

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

_Bool imap_endofresp(connectdata *conn,char *line,size_t len,int *resp)

{
  imapstate iVar1;
  SessionHandle *data;
  void *pvVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  size_t __n;
  ulong uVar6;
  char *pcVar7;
  
  data = conn->data;
  pvVar2 = (data->req).protop;
  pcVar7 = &(conn->proto).ftpc.transfertype;
  __n = strlen(pcVar7);
  uVar6 = __n + 1;
  if (((uVar6 <= len) && (iVar4 = bcmp(pcVar7,line,__n), iVar4 == 0)) && (line[__n] == ' ')) {
    pcVar7 = "Bad tagged response";
    if (len - uVar6 < 2) {
LAB_0049b017:
      Curl_failf(data,pcVar7);
      iVar4 = -1;
    }
    else if (*(short *)(line + uVar6) == 0x4b4f) {
      iVar4 = 0x4f;
    }
    else if (*(short *)(line + uVar6) == 0x4f4e) {
      iVar4 = 0x4e;
    }
    else {
      if ((len - uVar6 == 2) || (line[__n + 3] != 'D' || *(short *)(line + uVar6) != 0x4142))
      goto LAB_0049b017;
      iVar4 = 0x42;
    }
    goto switchD_0049b055_caseD_8;
  }
  if (len < 2) goto LAB_0049b16d;
  if (*(short *)line != 0x202a) {
    if (((len == 3) && (*line == '+')) || (*(short *)line == 0x202b)) {
      iVar1 = (conn->proto).imapc.state;
      iVar4 = 0x2b;
      if ((iVar1 != IMAP_AUTHENTICATE) && (iVar1 != IMAP_APPEND)) {
        pcVar7 = "Unexpected continuation response";
        goto LAB_0049b017;
      }
      goto switchD_0049b055_caseD_8;
    }
    goto LAB_0049b16d;
  }
  _Var3 = false;
  iVar4 = 0x2a;
  switch((conn->proto).imapc.state) {
  case IMAP_CAPABILITY:
    pcVar7 = "CAPABILITY";
    break;
  default:
    goto switchD_0049b055_caseD_3;
  case IMAP_LIST:
    pcVar7 = *(char **)((long)pvVar2 + 0x38);
    if (pcVar7 == (char *)0x0) {
      _Var3 = imap_matchresp(line,len,"LIST");
      if (!_Var3) goto LAB_0049b16d;
      pcVar7 = *(char **)((long)pvVar2 + 0x38);
      if (pcVar7 == (char *)0x0) goto switchD_0049b055_caseD_8;
    }
    _Var3 = imap_matchresp(line,len,pcVar7);
    if (!_Var3) {
      pcVar7 = *(char **)((long)pvVar2 + 0x38);
      iVar5 = strcmp(pcVar7,"STORE");
      if (iVar5 == 0) {
        _Var3 = imap_matchresp(line,len,"FETCH");
        if (_Var3) goto switchD_0049b055_caseD_8;
        pcVar7 = *(char **)((long)pvVar2 + 0x38);
      }
      iVar5 = strcmp(pcVar7,"SELECT");
      if (((((iVar5 != 0) && (iVar5 = strcmp(pcVar7,"EXAMINE"), iVar5 != 0)) &&
           (iVar5 = strcmp(pcVar7,"SEARCH"), iVar5 != 0)) &&
          ((iVar5 = strcmp(pcVar7,"EXPUNGE"), iVar5 != 0 &&
           (iVar5 = strcmp(pcVar7,"LSUB"), iVar5 != 0)))) &&
         ((iVar5 = strcmp(pcVar7,"UID"), iVar5 != 0 && (iVar5 = strcmp(pcVar7,"NOOP"), iVar5 != 0)))
         ) goto LAB_0049b16d;
    }
  case IMAP_SELECT:
    goto switchD_0049b055_caseD_8;
  case IMAP_FETCH:
    pcVar7 = "FETCH";
    break;
  case IMAP_SEARCH:
    pcVar7 = "SEARCH";
  }
  _Var3 = imap_matchresp(line,len,pcVar7);
  if (_Var3) {
switchD_0049b055_caseD_8:
    *resp = iVar4;
    _Var3 = true;
  }
  else {
LAB_0049b16d:
    _Var3 = false;
  }
switchD_0049b055_caseD_3:
  return _Var3;
}

Assistant:

static bool imap_endofresp(struct connectdata *conn, char *line, size_t len,
                           int *resp)
{
  struct IMAP *imap = conn->data->req.protop;
  struct imap_conn *imapc = &conn->proto.imapc;
  const char *id = imapc->resptag;
  size_t id_len = strlen(id);

  /* Do we have a tagged command response? */
  if(len >= id_len + 1 && !memcmp(id, line, id_len) && line[id_len] == ' ') {
    line += id_len + 1;
    len -= id_len + 1;

    if(len >= 2 && !memcmp(line, "OK", 2))
      *resp = 'O';
    else if(len >= 2 && !memcmp(line, "NO", 2))
      *resp = 'N';
    else if(len >= 3 && !memcmp(line, "BAD", 3))
      *resp = 'B';
    else {
      failf(conn->data, "Bad tagged response");
      *resp = -1;
    }

    return TRUE;
  }

  /* Do we have an untagged command response? */
  if(len >= 2 && !memcmp("* ", line, 2)) {
    switch(imapc->state) {
      /* States which are interested in untagged responses */
      case IMAP_CAPABILITY:
        if(!imap_matchresp(line, len, "CAPABILITY"))
          return FALSE;
        break;

      case IMAP_LIST:
        if((!imap->custom && !imap_matchresp(line, len, "LIST")) ||
          (imap->custom && !imap_matchresp(line, len, imap->custom) &&
           (strcmp(imap->custom, "STORE") ||
            !imap_matchresp(line, len, "FETCH")) &&
           strcmp(imap->custom, "SELECT") &&
           strcmp(imap->custom, "EXAMINE") &&
           strcmp(imap->custom, "SEARCH") &&
           strcmp(imap->custom, "EXPUNGE") &&
           strcmp(imap->custom, "LSUB") &&
           strcmp(imap->custom, "UID") &&
           strcmp(imap->custom, "NOOP")))
          return FALSE;
        break;

      case IMAP_SELECT:
        /* SELECT is special in that its untagged responses do not have a
           common prefix so accept anything! */
        break;

      case IMAP_FETCH:
        if(!imap_matchresp(line, len, "FETCH"))
          return FALSE;
        break;

      case IMAP_SEARCH:
        if(!imap_matchresp(line, len, "SEARCH"))
          return FALSE;
        break;

      /* Ignore other untagged responses */
      default:
        return FALSE;
    }

    *resp = '*';
    return TRUE;
  }

  /* Do we have a continuation response? This should be a + symbol followed by
     a space and optionally some text as per RFC-3501 for the AUTHENTICATE and
     APPEND commands and as outlined in Section 4. Examples of RFC-4959 but
     some e-mail servers ignore this and only send a single + instead. */
  if((len == 3 && !memcmp("+", line, 1)) ||
     (len >= 2 && !memcmp("+ ", line, 2))) {
    switch(imapc->state) {
      /* States which are interested in continuation responses */
      case IMAP_AUTHENTICATE:
      case IMAP_APPEND:
        *resp = '+';
        break;

      default:
        failf(conn->data, "Unexpected continuation response");
        *resp = -1;
        break;
    }

    return TRUE;
  }

  return FALSE; /* Nothing for us */
}